

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O2

bool Gudhi::persistence_matrix::operator<
               (List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                *c1,List_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>
                    *c2)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  Column_support *pCVar3;
  
  if (c1 == c2) {
    return false;
  }
  pCVar3 = &c2->column_;
  p_Var1 = (_List_node_base *)pCVar3;
  p_Var2 = (_List_node_base *)&c1->column_;
  while( true ) {
    p_Var2 = (((_List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
                *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    p_Var1 = (((_List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
                *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)&c1->column_) {
      return p_Var1 != (_List_node_base *)pCVar3;
    }
    if (p_Var1 == (_List_node_base *)pCVar3) break;
    if (*(uint *)p_Var2[1]._M_next != *(uint *)p_Var1[1]._M_next) {
      return *(uint *)p_Var2[1]._M_next < *(uint *)p_Var1[1]._M_next;
    }
  }
  return p_Var1 != (_List_node_base *)pCVar3;
}

Assistant:

bool operator<(const List_column& c1, const List_column& c2) {
    if (&c1 == &c2) return false;

    auto it1 = c1.column_.begin();
    auto it2 = c2.column_.begin();
    while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
      if ((*it1)->get_row_index() != (*it2)->get_row_index()) return (*it1)->get_row_index() < (*it2)->get_row_index();
      if constexpr (!Master_matrix::Option_list::is_z2) {
        if ((*it1)->get_element() != (*it2)->get_element()) return (*it1)->get_element() < (*it2)->get_element();
      }
      ++it1;
      ++it2;
    }
    return it2 != c2.column_.end();
  }